

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Granulator.cpp
# Opt level: O2

int Granulator::SetFloatParameterCallback(UnityAudioEffectState *state,int index,float value)

{
  EffectData *pEVar1;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<Granulator::EffectData>(state);
  if (index < 0xd) {
    pEVar1->p[index] = value;
  }
  return (uint)(index >= 0xd);
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK SetFloatParameterCallback(UnityAudioEffectState* state, int index, float value)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        data->p[index] = value;
        return UNITY_AUDIODSP_OK;
    }